

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_cepstrum_postfilter.cc
# Opt level: O1

bool __thiscall
sptk::MelCepstrumPostfilter::Run
          (MelCepstrumPostfilter *this,vector<double,_std::allocator<double>_> *mel_cepstrum,
          vector<double,_std::allocator<double>_> *postfiltered_mel_cepstrum,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *autocorrelation;
  double dVar1;
  double *pdVar2;
  bool bVar3;
  pointer pdVar4;
  double *pdVar5;
  size_t __n;
  size_type __new_size;
  vector<double,_std::allocator<double>_> *pvVar6;
  double dVar7;
  
  if (this->is_valid_ == true) {
    if (buffer == (Buffer *)0x0) {
      return false;
    }
    if (postfiltered_mel_cepstrum == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    __new_size = (long)(this->frequency_transform_).num_input_order_ + 1;
    if ((long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      return false;
    }
    if ((long)(postfiltered_mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(postfiltered_mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(postfiltered_mel_cepstrum,__new_size);
    }
    this_00 = &buffer->mel_cepstrum_;
    if ((long)(buffer->mel_cepstrum_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->mel_cepstrum_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
    }
    if ((this->beta_ == 0.0) && (!NAN(this->beta_))) {
      pdVar4 = (mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __n = (long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar4;
      if (__n == 0) {
        return true;
      }
      memmove((postfiltered_mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>).
              _M_impl.super__Vector_impl_data._M_start,pdVar4,__n);
      return true;
    }
    pvVar6 = &buffer->cepstrum_;
    bVar3 = FrequencyTransform::Run
                      (&this->frequency_transform_,mel_cepstrum,pvVar6,
                       &buffer->buffer_for_frequency_transform_);
    if (bVar3) {
      autocorrelation = &buffer->autocorrelation_;
      bVar3 = CepstrumToAutocorrelation::Run
                        (&this->cepstrum_to_autocorrelation_,pvVar6,autocorrelation,
                         &buffer->buffer_for_cepstrum_to_autocorrelation_);
      if (bVar3) {
        dVar7 = *(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)this->onset_index_ != 0) {
          memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start,
                  (mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start,(long)this->onset_index_ << 3);
        }
        pdVar5 = (mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + this->onset_index_;
        pdVar2 = (mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pdVar5 != pdVar2) {
          dVar1 = this->beta_;
          pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start + this->onset_index_;
          do {
            *pdVar4 = *pdVar5 * (dVar1 + 1.0);
            pdVar5 = pdVar5 + 1;
            pdVar4 = pdVar4 + 1;
          } while (pdVar5 != pdVar2);
        }
        bVar3 = FrequencyTransform::Run
                          (&this->frequency_transform_,this_00,pvVar6,
                           &buffer->buffer_for_frequency_transform_);
        if ((bVar3) &&
           (bVar3 = CepstrumToAutocorrelation::Run
                              (&this->cepstrum_to_autocorrelation_,pvVar6,autocorrelation,
                               &buffer->buffer_for_cepstrum_to_autocorrelation_), bVar3)) {
          dVar1 = *(buffer->autocorrelation_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pvVar6 = &buffer->mlsa_digital_filter_coefficients_;
          bVar3 = MelCepstrumToMlsaDigitalFilterCoefficients::Run
                            (&this->mel_cepstrum_to_mlsa_digital_filter_coefficients_,this_00,pvVar6
                            );
          if (bVar3) {
            dVar7 = log(dVar7 / dVar1);
            pdVar2 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            *pdVar2 = dVar7 * 0.5 + *pdVar2;
            bVar3 = MlsaDigitalFilterCoefficientsToMelCepstrum::Run
                              (&this->mlsa_digital_filter_coefficients_to_mel_cepstrum_,pvVar6,
                               postfiltered_mel_cepstrum);
            return bVar3;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool MelCepstrumPostfilter::Run(const std::vector<double>& mel_cepstrum,
                                std::vector<double>* postfiltered_mel_cepstrum,
                                MelCepstrumPostfilter::Buffer* buffer) const {
  // Check inputs.
  const int length(GetNumOrder() + 1);
  if (!is_valid_ || mel_cepstrum.size() != static_cast<std::size_t>(length) ||
      NULL == postfiltered_mel_cepstrum || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (postfiltered_mel_cepstrum->size() != static_cast<std::size_t>(length)) {
    postfiltered_mel_cepstrum->resize(length);
  }
  if (buffer->mel_cepstrum_.size() != static_cast<std::size_t>(length)) {
    buffer->mel_cepstrum_.resize(length);
  }

  // Handle special case.
  if (0.0 == beta_) {
    std::copy(mel_cepstrum.begin(), mel_cepstrum.end(),
              postfiltered_mel_cepstrum->begin());
    return true;
  }

  // Calculate energy of original mel-cepstrum.
  {
    if (!frequency_transform_.Run(mel_cepstrum, &buffer->cepstrum_,
                                  &buffer->buffer_for_frequency_transform_)) {
      return false;
    }
    if (!cepstrum_to_autocorrelation_.Run(
            buffer->cepstrum_, &buffer->autocorrelation_,
            &buffer->buffer_for_cepstrum_to_autocorrelation_)) {
      return false;
    }
  }
  const double original_energy(buffer->autocorrelation_[0]);

  // Calculate energy of modified mel-cepstrum.
  {
    std::copy(mel_cepstrum.begin(), mel_cepstrum.begin() + onset_index_,
              buffer->mel_cepstrum_.begin());
    const double weight(1.0 + beta_);
    std::transform(mel_cepstrum.begin() + onset_index_, mel_cepstrum.end(),
                   buffer->mel_cepstrum_.begin() + onset_index_,
                   [weight](double c) { return c * weight; });

    if (!frequency_transform_.Run(buffer->mel_cepstrum_, &buffer->cepstrum_,
                                  &buffer->buffer_for_frequency_transform_)) {
      return false;
    }
    if (!cepstrum_to_autocorrelation_.Run(
            buffer->cepstrum_, &buffer->autocorrelation_,
            &buffer->buffer_for_cepstrum_to_autocorrelation_)) {
      return false;
    }
  }
  const double modified_energy(buffer->autocorrelation_[0]);

  // Adjust gain.
  {
    if (!mel_cepstrum_to_mlsa_digital_filter_coefficients_.Run(
            buffer->mel_cepstrum_,
            &buffer->mlsa_digital_filter_coefficients_)) {
      return false;
    }

    buffer->mlsa_digital_filter_coefficients_[0] +=
        (0.5 * std::log(original_energy / modified_energy));

    if (!mlsa_digital_filter_coefficients_to_mel_cepstrum_.Run(
            buffer->mlsa_digital_filter_coefficients_,
            postfiltered_mel_cepstrum)) {
      return false;
    }
  }

  return true;
}